

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

Vec4 __thiscall
gl4cts::TextureViewTestViewSampling::getRandomReferenceColor(TextureViewTestViewSampling *this)

{
  undefined8 extraout_XMM0_Qa;
  float y_;
  undefined8 in_XMM1_Qa;
  undefined4 uVar2;
  Vec4 VVar3;
  _func_int **local_28;
  TestContext *local_20;
  TextureViewTestViewSampling *this_local;
  Vec4 *result;
  undefined8 uVar1;
  
  uVar2 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  this_local = this;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  y_ = (float)(int)(((getRandomReferenceColor::seed << 3) / 0xff) * -0xff +
                   getRandomReferenceColor::seed * 8) / 255.0;
  uVar1 = CONCAT44(uVar2,y_);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&local_28,(float)(getRandomReferenceColor::seed % 0xff) / 255.0,y_,
             (float)((getRandomReferenceColor::seed * 0x10) % 0xff) / 255.0,
             (float)((getRandomReferenceColor::seed * 0x20) % 0xff) / 255.0);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = local_28;
  (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = local_20;
  getRandomReferenceColor::seed = getRandomReferenceColor::seed + 0x11;
  VVar3.m_data[2] = (float)(int)uVar1;
  VVar3.m_data[3] = (float)(int)((ulong)uVar1 >> 0x20);
  VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar3.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar3.m_data;
}

Assistant:

tcu::Vec4 TextureViewTestViewSampling::getRandomReferenceColor()
{
	static unsigned int seed = 195;
	tcu::Vec4			result;

	result = tcu::Vec4(float((seed) % 255) / 255.0f, float((seed << 3) % 255) / 255.0f,
					   float((seed << 4) % 255) / 255.0f, float((seed << 5) % 255) / 255.0f);

	seed += 17;

	return result;
}